

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-client.c
# Opt level: O3

int lws_tls_client_create_vhost_context
              (lws_vhost *vh,lws_context_creation_info *info,char *cipher_list,char *ca_filepath,
              void *ca_mem,uint ca_mem_len,char *cert_filepath,void *cert_mem,uint cert_mem_len,
              char *private_key_filepath)

{
  long *d;
  lws_context *plVar1;
  lws_context_creation_info *info_00;
  int iVar2;
  lws_tls_extant lVar3;
  uint uVar4;
  SSL_METHOD *pSVar5;
  EVP_MD_CTX *ctx;
  EVP_MD *type;
  size_t sVar6;
  int *piVar7;
  SSL_CTX *pSVar8;
  undefined8 *data;
  ulong uVar9;
  char *pcVar10;
  X509 *x;
  X509_STORE *ctx_00;
  lws_dll2 *plVar11;
  char *pcVar12;
  bool bVar13;
  lws_filepos_t amount;
  uint8_t *up;
  uint8_t hash [32];
  undefined1 local_a5;
  uint local_a4;
  char *local_a0;
  uint8_t *local_98;
  char *local_90;
  char *local_88;
  lws_filepos_t local_80;
  long *local_78;
  lws_context_creation_info *local_70;
  SSL_METHOD *local_68;
  uint8_t *local_60;
  uchar local_58 [40];
  
  local_88 = cipher_list;
  pSVar5 = (SSL_METHOD *)TLS_client_method();
  if (pSVar5 == (SSL_METHOD *)0x0) {
    uVar9 = ERR_get_error();
    pcVar10 = ERR_error_string(uVar9,(char *)vh->context->pt[0].serv_buf);
    pcVar12 = "problem creating ssl method %lu: %s\n";
LAB_00129b40:
    _lws_log(1,pcVar12,uVar9,pcVar10);
    return 1;
  }
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (ctx != (EVP_MD_CTX *)0x0) {
    type = EVP_sha256();
    iVar2 = EVP_DigestInit_ex(ctx,type,(ENGINE *)0x0);
    if (iVar2 != 1) {
      EVP_MD_CTX_free(ctx);
      return 1;
    }
    d = &info->ssl_client_options_set;
    local_68 = pSVar5;
    if (info->ssl_client_options_set != 0) {
      EVP_DigestUpdate(ctx,d,8);
    }
    local_78 = d;
    if (info->ssl_client_options_clear != 0) {
      EVP_DigestUpdate(ctx,&info->ssl_client_options_clear,8);
    }
    pcVar10 = local_88;
    local_90 = ca_filepath;
    if (local_88 != (char *)0x0) {
      sVar6 = strlen(local_88);
      EVP_DigestUpdate(ctx,pcVar10,sVar6);
    }
    pcVar10 = info->client_tls_1_3_plus_cipher_list;
    if (pcVar10 != (char *)0x0) {
      sVar6 = strlen(pcVar10);
      EVP_DigestUpdate(ctx,pcVar10,sVar6);
    }
    if ((vh->options & 0x40) == 0) {
      local_a5 = 1;
      EVP_DigestUpdate(ctx,&local_a5,1);
    }
    pcVar10 = local_90;
    local_a0 = (char *)ca_mem;
    if (local_90 != (char *)0x0) {
      sVar6 = strlen(local_90);
      EVP_DigestUpdate(ctx,pcVar10,sVar6);
    }
    if (cert_filepath != (char *)0x0) {
      sVar6 = strlen(cert_filepath);
      EVP_DigestUpdate(ctx,cert_filepath,sVar6);
    }
    if (private_key_filepath != (char *)0x0) {
      sVar6 = strlen(private_key_filepath);
      EVP_DigestUpdate(ctx,private_key_filepath,sVar6);
    }
    bVar13 = local_a0 == (char *)0x0;
    if (ca_mem_len != 0 && !bVar13) {
      EVP_DigestUpdate(ctx,local_a0,(ulong)ca_mem_len);
    }
    local_70 = info;
    if (cert_mem_len != 0 && cert_mem != (void *)0x0) {
      EVP_DigestUpdate(ctx,cert_mem,(ulong)cert_mem_len);
    }
    local_a4 = 0x20;
    EVP_DigestFinal_ex(ctx,local_58,&local_a4);
    EVP_MD_CTX_free(ctx);
    plVar11 = (vh->context->tls).cc_owner.head;
    if (plVar11 != (lws_dll2 *)0x0) {
      uVar9 = (ulong)local_a4;
      do {
        iVar2 = bcmp(local_58,&plVar11[-2].owner,uVar9);
        if (iVar2 == 0) {
          *(int *)&plVar11[1].prev = *(int *)&plVar11[1].prev + 1;
          (vh->tls).ssl_client_ctx = (lws_tls_ctx *)plVar11[-2].next;
          _lws_log(8,"%s: vh %s: reusing client ctx %d: use %d\n",
                   "lws_tls_client_create_vhost_context",vh->name,
                   (ulong)*(uint *)((long)&plVar11[1].prev + 4));
          return 0;
        }
        plVar11 = plVar11->next;
      } while (plVar11 != (lws_dll2 *)0x0);
    }
    piVar7 = __errno_location();
    *piVar7 = 0;
    ERR_clear_error();
    pSVar8 = SSL_CTX_new(local_68);
    (vh->tls).ssl_client_ctx = (lws_tls_ctx *)pSVar8;
    if (pSVar8 == (SSL_CTX *)0x0) {
      uVar9 = ERR_get_error();
      pcVar10 = ERR_error_string(uVar9,(char *)vh->context->pt[0].serv_buf);
      pcVar12 = "problem creating ssl context %lu: %s\n";
      goto LAB_00129b40;
    }
    data = (undefined8 *)lws_zalloc(0x48,"client ctx tcr");
    pSVar8 = (SSL_CTX *)(vh->tls).ssl_client_ctx;
    if (data == (undefined8 *)0x0) {
      SSL_CTX_free(pSVar8);
      return 1;
    }
    *data = pSVar8;
    *(undefined4 *)(data + 8) = 1;
    memcpy(data + 1,local_58,(ulong)local_a4);
    plVar1 = vh->context;
    iVar2 = (plVar1->tls).count_client_contexts;
    (plVar1->tls).count_client_contexts = iVar2 + 1;
    *(int *)((long)data + 0x44) = iVar2;
    lws_dll2_add_head((lws_dll2 *)(data + 5),&(plVar1->tls).cc_owner);
    _lws_log(8,"%s: vh %s: created new client ctx %d\n","lws_tls_client_create_vhost_context",
             vh->name,(ulong)*(uint *)((long)data + 0x44));
    SSL_CTX_set_ex_data((SSL_CTX *)(vh->tls).ssl_client_ctx,openssl_SSL_CTX_private_data_index,data)
    ;
    SSL_CTX_set_options((vh->tls).ssl_client_ctx,0x20000);
    SSL_CTX_set_options((vh->tls).ssl_client_ctx,0x400000);
    SSL_CTX_ctrl((SSL_CTX *)(vh->tls).ssl_client_ctx,0x21,0x12,(void *)0x0);
    if (*local_78 != 0) {
      SSL_CTX_set_options((vh->tls).ssl_client_ctx);
    }
    info_00 = local_70;
    if (info->ssl_client_options_clear != 0) {
      SSL_CTX_clear_options((vh->tls).ssl_client_ctx);
    }
    pcVar10 = local_90;
    if (local_88 != (char *)0x0) {
      SSL_CTX_set_cipher_list((SSL_CTX *)(vh->tls).ssl_client_ctx,local_88);
    }
    if (info_00->client_tls_1_3_plus_cipher_list != (char *)0x0) {
      SSL_CTX_set_ciphersuites((vh->tls).ssl_client_ctx);
    }
    if ((vh->options & 0x40) == 0) {
      SSL_CTX_set_default_verify_paths((SSL_CTX *)(vh->tls).ssl_client_ctx);
    }
    pcVar12 = local_a0;
    if (pcVar10 == (char *)0x0 && (ca_mem_len == 0 || bVar13)) {
      iVar2 = SSL_CTX_load_verify_locations
                        ((SSL_CTX *)(vh->tls).ssl_client_ctx,(char *)0x0,"../share");
      if (iVar2 == 0) {
        _lws_log(1,
                 "Unable to load SSL Client certs from %s (set by LWS_OPENSSL_CLIENT_CERTS) -- client ssl isn\'t going to work\n"
                 ,"../share");
      }
    }
    else if (pcVar10 == (char *)0x0) {
      local_80 = 0;
      iVar2 = lws_tls_alloc_pem_to_der_file
                        (vh->context,(char *)0x0,local_a0,(ulong)ca_mem_len,&local_98,&local_80);
      if (iVar2 != 0) {
        _lws_log(1,"%s: Unable to decode x.509 mem\n","lws_tls_client_create_vhost_context");
        lwsl_hexdump_level(4,pcVar12,(ulong)ca_mem_len);
        return 1;
      }
      local_60 = local_98;
      x = d2i_X509((X509 **)0x0,&local_60,local_80);
      if (x == (X509 *)0x0) {
        _lws_log(1,"%s: d2i_X509 failed\n","lws_tls_client_create_vhost_context");
        lwsl_hexdump_level(4,local_98,local_80);
        lws_tls_err_describe_clear();
      }
      else {
        ctx_00 = X509_STORE_new();
        iVar2 = X509_STORE_add_cert(ctx_00,x);
        if (iVar2 == 0) {
          X509_STORE_free(ctx_00);
          _lws_log(1,
                   "Unable to load SSL Client certs from ssl_ca_mem -- client ssl isn\'t going to work\n"
                  );
          lws_tls_err_describe_clear();
        }
        else {
          SSL_CTX_set_cert_store((SSL_CTX *)(vh->tls).ssl_client_ctx,ctx_00);
          _lws_log(8,"loaded ssl_ca_mem\n");
        }
        X509_free(x);
      }
      lws_realloc(local_98,0,"lws_free");
    }
    else {
      iVar2 = SSL_CTX_load_verify_locations((SSL_CTX *)(vh->tls).ssl_client_ctx,pcVar10,(char *)0x0)
      ;
      if (iVar2 == 0) {
        _lws_log(1,
                 "Unable to load SSL Client certs file from %s -- client ssl isn\'t going to work\n"
                 ,pcVar10);
        lws_tls_err_describe_clear();
      }
      else {
        _lws_log(8,"loaded ssl_ca_filepath\n");
      }
    }
    if (cert_filepath == (char *)0x0) {
      if ((cert_mem_len != 0 && cert_mem != (void *)0x0) &&
         (iVar2 = SSL_CTX_use_certificate_ASN1
                            ((SSL_CTX *)(vh->tls).ssl_client_ctx,cert_mem_len,(uchar *)cert_mem),
         iVar2 < 1)) {
        _lws_log(1,"%s: problem interpreting client cert\n","lws_tls_client_create_vhost_context");
        goto LAB_00129f27;
      }
    }
    else {
      lVar3 = lws_tls_use_any_upgrade_check_extant(cert_filepath);
      if ((lVar3 != LWS_TLS_EXTANT_YES) && ((info_00->options & 0x4000000) != 0)) {
        return 0;
      }
      _lws_log(4,"%s: doing cert filepath %s\n","lws_tls_client_create_vhost_context",cert_filepath)
      ;
      uVar4 = SSL_CTX_use_certificate_chain_file((SSL_CTX *)(vh->tls).ssl_client_ctx,cert_filepath);
      if ((int)uVar4 < 1) {
        _lws_log(1,"problem %d getting cert \'%s\'\n",(ulong)uVar4,cert_filepath);
LAB_00129f27:
        lws_tls_err_describe_clear();
        return 1;
      }
      _lws_log(4,"Loaded client cert %s\n",cert_filepath);
    }
    if (private_key_filepath == (char *)0x0) {
      return 0;
    }
    _lws_log(4,"%s: doing private key filepath\n","lws_tls_client_create_vhost_context");
    lws_ssl_bind_passphrase((vh->tls).ssl_client_ctx,1,info_00);
    iVar2 = SSL_CTX_use_PrivateKey_file((SSL_CTX *)(vh->tls).ssl_client_ctx,private_key_filepath,1);
    if (iVar2 == 1) {
      _lws_log(4,"Loaded client cert private key %s\n",private_key_filepath);
      iVar2 = SSL_CTX_check_private_key((SSL_CTX *)(vh->tls).ssl_client_ctx);
      if (iVar2 == 0) {
        _lws_log(1,"Private SSL key doesn\'t match cert\n");
        return 1;
      }
      return 0;
    }
    _lws_log(1,"use_PrivateKey_file \'%s\'\n",private_key_filepath);
    lws_tls_err_describe_clear();
  }
  return 1;
}

Assistant:

int
lws_tls_client_create_vhost_context(struct lws_vhost *vh,
				    const struct lws_context_creation_info *info,
				    const char *cipher_list,
				    const char *ca_filepath,
				    const void *ca_mem,
				    unsigned int ca_mem_len,
				    const char *cert_filepath,
				    const void *cert_mem,
				    unsigned int cert_mem_len,
				    const char *private_key_filepath)
{
	struct lws_tls_client_reuse *tcr;
	X509_STORE *x509_store;
	unsigned long error;
	SSL_METHOD *method;
	EVP_MD_CTX *mdctx;
	unsigned int len;
	uint8_t hash[32];
	X509 *client_CA;
	char c;
	int n;

	/* basic openssl init already happened in context init */

	/* choose the most recent spin of the api */
#if defined(LWS_HAVE_TLS_CLIENT_METHOD)
	method = (SSL_METHOD *)TLS_client_method();
#elif defined(LWS_HAVE_TLSV1_2_CLIENT_METHOD)
	method = (SSL_METHOD *)TLSv1_2_client_method();
#else
	method = (SSL_METHOD *)SSLv23_client_method();
#endif

	if (!method) {
		error = ERR_get_error();
		lwsl_err("problem creating ssl method %lu: %s\n",
			error, ERR_error_string(error,
				      (char *)vh->context->pt[0].serv_buf));
		return 1;
	}

	/*
	 * OpenSSL client contexts are quite expensive, because they bring in
	 * the system certificate bundle for each one.  So if you have multiple
	 * vhosts, each with a client context, it can add up to several
	 * megabytes of heap.  In the case the client contexts are configured
	 * identically, they could perfectly well have shared just the one.
	 *
	 * For that reason, use a hash to fingerprint the context configuration
	 * and prefer to reuse an existing one with the same fingerprint if
	 * possible.
	 */

	 mdctx = EVP_MD_CTX_create();
	 if (!mdctx)
		 return 1;

	if (EVP_DigestInit_ex(mdctx, EVP_sha256(), NULL) != 1) {
		EVP_MD_CTX_destroy(mdctx);

		return 1;
	}

	if (info->ssl_client_options_set)
		EVP_DigestUpdate(mdctx, &info->ssl_client_options_set,
				 sizeof(info->ssl_client_options_set));

#if (OPENSSL_VERSION_NUMBER >= 0x009080df) && !defined(USE_WOLFSSL)
	if (info->ssl_client_options_clear)
		EVP_DigestUpdate(mdctx, &info->ssl_client_options_clear,
				 sizeof(info->ssl_client_options_clear));
#endif

	if (cipher_list)
		EVP_DigestUpdate(mdctx, cipher_list, strlen(cipher_list));

#if defined(LWS_HAVE_SSL_CTX_set_ciphersuites)
	if (info->client_tls_1_3_plus_cipher_list)
		EVP_DigestUpdate(mdctx, info->client_tls_1_3_plus_cipher_list,
				 strlen(info->client_tls_1_3_plus_cipher_list));
#endif

	if (!lws_check_opt(vh->options, LWS_SERVER_OPTION_DISABLE_OS_CA_CERTS)) {
		c = 1;
		EVP_DigestUpdate(mdctx, &c, 1);
	}

	if (ca_filepath)
		EVP_DigestUpdate(mdctx, ca_filepath, strlen(ca_filepath));

	if (cert_filepath)
		EVP_DigestUpdate(mdctx, cert_filepath, strlen(cert_filepath));

	if (private_key_filepath)
		EVP_DigestUpdate(mdctx, private_key_filepath,
				 strlen(private_key_filepath));
	if (ca_mem && ca_mem_len)
		EVP_DigestUpdate(mdctx, ca_mem, ca_mem_len);

	if (cert_mem && cert_mem_len)
		EVP_DigestUpdate(mdctx, cert_mem, cert_mem_len);

	len = sizeof(hash);
	EVP_DigestFinal_ex(mdctx, hash, &len);
	EVP_MD_CTX_destroy(mdctx);

	/* look for existing client context with same config already */

	lws_start_foreach_dll_safe(struct lws_dll2 *, p, tp,
			 lws_dll2_get_head(&vh->context->tls.cc_owner)) {
		tcr = lws_container_of(p, struct lws_tls_client_reuse, cc_list);

		if (!memcmp(hash, tcr->hash, len)) {

			/* it's a match */

			tcr->refcount++;
			vh->tls.ssl_client_ctx = tcr->ssl_client_ctx;

			lwsl_info("%s: vh %s: reusing client ctx %d: use %d\n",
				   __func__, vh->name, tcr->index,
				   tcr->refcount);

			return 0;
		}
	} lws_end_foreach_dll_safe(p, tp);

	/* no existing one the same... create new client SSL_CTX */

	errno = 0;
	ERR_clear_error();
	vh->tls.ssl_client_ctx = SSL_CTX_new(method);
	if (!vh->tls.ssl_client_ctx) {
		error = ERR_get_error();
		lwsl_err("problem creating ssl context %lu: %s\n",
			error, ERR_error_string(error,
				      (char *)vh->context->pt[0].serv_buf));
		return 1;
	}

	tcr = lws_zalloc(sizeof(*tcr), "client ctx tcr");
	if (!tcr) {
		SSL_CTX_free(vh->tls.ssl_client_ctx);
		return 1;
	}

	tcr->ssl_client_ctx = vh->tls.ssl_client_ctx;
	tcr->refcount = 1;
	memcpy(tcr->hash, hash, len);
	tcr->index = vh->context->tls.count_client_contexts++;
	lws_dll2_add_head(&tcr->cc_list, &vh->context->tls.cc_owner);

	lwsl_info("%s: vh %s: created new client ctx %d\n", __func__,
			vh->name, tcr->index);

	/* bind the tcr to the client context */

	SSL_CTX_set_ex_data(vh->tls.ssl_client_ctx,
			    openssl_SSL_CTX_private_data_index,
			    (char *)tcr);

#ifdef SSL_OP_NO_COMPRESSION
	SSL_CTX_set_options(vh->tls.ssl_client_ctx, SSL_OP_NO_COMPRESSION);
#endif

	SSL_CTX_set_options(vh->tls.ssl_client_ctx,
			    SSL_OP_CIPHER_SERVER_PREFERENCE);

	SSL_CTX_set_mode(vh->tls.ssl_client_ctx,
			 SSL_MODE_ACCEPT_MOVING_WRITE_BUFFER |
			 SSL_MODE_RELEASE_BUFFERS);

	if (info->ssl_client_options_set)
		SSL_CTX_set_options(vh->tls.ssl_client_ctx,
				    info->ssl_client_options_set);

	/* SSL_clear_options introduced in 0.9.8m */
#if (OPENSSL_VERSION_NUMBER >= 0x009080df) && !defined(USE_WOLFSSL)
	if (info->ssl_client_options_clear)
		SSL_CTX_clear_options(vh->tls.ssl_client_ctx,
				      info->ssl_client_options_clear);
#endif

	if (cipher_list)
		SSL_CTX_set_cipher_list(vh->tls.ssl_client_ctx, cipher_list);

#if defined(LWS_HAVE_SSL_CTX_set_ciphersuites)
	if (info->client_tls_1_3_plus_cipher_list)
		SSL_CTX_set_ciphersuites(vh->tls.ssl_client_ctx,
					 info->client_tls_1_3_plus_cipher_list);
#endif

#ifdef LWS_SSL_CLIENT_USE_OS_CA_CERTS
	if (!lws_check_opt(vh->options, LWS_SERVER_OPTION_DISABLE_OS_CA_CERTS))
		/* loads OS default CA certs */
		SSL_CTX_set_default_verify_paths(vh->tls.ssl_client_ctx);
#endif

	/* openssl init for cert verification (for client sockets) */
	if (!ca_filepath && (!ca_mem || !ca_mem_len)) {
		if (!SSL_CTX_load_verify_locations(
			vh->tls.ssl_client_ctx, NULL, LWS_OPENSSL_CLIENT_CERTS))
			lwsl_err("Unable to load SSL Client certs from %s "
			    "(set by LWS_OPENSSL_CLIENT_CERTS) -- "
			    "client ssl isn't going to work\n",
			    LWS_OPENSSL_CLIENT_CERTS);
	} else if (ca_filepath) {
		if (!SSL_CTX_load_verify_locations(
			vh->tls.ssl_client_ctx, ca_filepath, NULL)) {
			lwsl_err(
				"Unable to load SSL Client certs "
				"file from %s -- client ssl isn't "
				"going to work\n", ca_filepath);
			lws_tls_err_describe_clear();
		}
		else
			lwsl_info("loaded ssl_ca_filepath\n");
	} else {

		lws_filepos_t amount = 0;
		uint8_t *up1;
		const uint8_t *up;

		if (lws_tls_alloc_pem_to_der_file(vh->context, NULL, ca_mem,
						  ca_mem_len, &up1,
						  &amount)) {
			lwsl_err("%s: Unable to decode x.509 mem\n", __func__);
			lwsl_hexdump_notice(ca_mem, ca_mem_len);
			return 1;
		}

		up = up1;
		client_CA = d2i_X509(NULL, &up, (long)amount);
		if (!client_CA) {
			lwsl_err("%s: d2i_X509 failed\n", __func__);
			lwsl_hexdump_notice(up1, (size_t)amount);
			lws_tls_err_describe_clear();
		} else {
			x509_store = X509_STORE_new();
			if (!X509_STORE_add_cert(x509_store, client_CA)) {
				X509_STORE_free(x509_store);
				lwsl_err("Unable to load SSL Client certs from "
					 "ssl_ca_mem -- client ssl isn't going to "
					 "work\n");
				lws_tls_err_describe_clear();
			} else {
				/* it doesn't increment x509_store ref counter */
				SSL_CTX_set_cert_store(vh->tls.ssl_client_ctx,
						       x509_store);
				lwsl_info("loaded ssl_ca_mem\n");
			}
		}
		if (client_CA)
			X509_free(client_CA);
		lws_free(up1);
	//	lws_tls_client_vhost_extra_cert_mem(vh, ca_mem, ca_mem_len);
	}

	/*
	 * callback allowing user code to load extra verification certs
	 * helping the client to verify server identity
	 */

	/* support for client-side certificate authentication */
	if (cert_filepath) {
		if (lws_tls_use_any_upgrade_check_extant(cert_filepath) !=
				LWS_TLS_EXTANT_YES &&
		    (info->options & LWS_SERVER_OPTION_IGNORE_MISSING_CERT))
			return 0;

		lwsl_notice("%s: doing cert filepath %s\n", __func__,
				cert_filepath);
		n = SSL_CTX_use_certificate_chain_file(vh->tls.ssl_client_ctx,
						       cert_filepath);
		if (n < 1) {
			lwsl_err("problem %d getting cert '%s'\n", n,
				 cert_filepath);
			lws_tls_err_describe_clear();
			return 1;
		}
		lwsl_notice("Loaded client cert %s\n", cert_filepath);
	} else if (cert_mem && cert_mem_len) {
		n = SSL_CTX_use_certificate_ASN1(vh->tls.ssl_client_ctx,
						 cert_mem_len, cert_mem);
		if (n < 1) {
			lwsl_err("%s: problem interpreting client cert\n",
				 __func__);
			lws_tls_err_describe_clear();
			return 1;
		}
	}
	if (private_key_filepath) {
		lwsl_notice("%s: doing private key filepath\n", __func__);
		lws_ssl_bind_passphrase(vh->tls.ssl_client_ctx, 1, info);
		/* set the private key from KeyFile */
		if (SSL_CTX_use_PrivateKey_file(vh->tls.ssl_client_ctx,
		    private_key_filepath, SSL_FILETYPE_PEM) != 1) {
			lwsl_err("use_PrivateKey_file '%s'\n",
				 private_key_filepath);
			lws_tls_err_describe_clear();
			return 1;
		}
		lwsl_notice("Loaded client cert private key %s\n",
			    private_key_filepath);

		/* verify private key */
		if (!SSL_CTX_check_private_key(vh->tls.ssl_client_ctx)) {
			lwsl_err("Private SSL key doesn't match cert\n");
			return 1;
		}
	}

	return 0;
}